

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void print_time(FILE *fp)

{
  char local_29 [8];
  char time_string [9];
  tm *time_info;
  time_t raw_time;
  FILE *fp_local;
  
  raw_time = (time_t)fp;
  time((time_t *)&time_info);
  time_string._1_8_ = localtime((time_t *)&time_info);
  memset(local_29,0,9);
  strftime(local_29,9,"%H:%M:%S",(tm *)time_string._1_8_);
  fprintf((FILE *)raw_time,"%s  ",local_29);
  return;
}

Assistant:

void print_time(FILE* fp) {
    time_t raw_time;
    time (&raw_time);
    struct tm * time_info = localtime(&raw_time);

    char time_string[9] = {0};
    strftime(time_string, 9, "%H:%M:%S", time_info);

    fprintf(fp, "%s  ", time_string);
}